

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.h
# Opt level: O0

uint32 google::protobuf::Bits::Log2FloorNonZero64(uint64 n)

{
  long lVar1;
  uint64 n_local;
  
  lVar1 = 0x3f;
  if (n != 0) {
    for (; n >> lVar1 == 0; lVar1 = lVar1 + -1) {
    }
  }
  return (uint32)lVar1;
}

Assistant:

static uint32 Log2FloorNonZero64(uint64 n) {
    // arm-nacl-clang runs into an instruction-selection failure when it
    // encounters __builtin_clzll:
    // https://bugs.chromium.org/p/nativeclient/issues/detail?id=4395
    // To work around this, when we build for NaCl we use the portable
    // implementation instead.
#if defined(__GNUC__) && !defined(GOOGLE_PROTOBUF_OS_NACL)
  return 63 ^ __builtin_clzll(n);
#else
  return Log2FloorNonZero64_Portable(n);
#endif
  }